

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int solver2_lit_removable_rec(sat_solver2 *s,int v)

{
  uint uVar1;
  int iVar2;
  clause *pcVar3;
  bool bVar4;
  int local_30;
  int local_2c;
  int x;
  int i;
  clause *c;
  int v_local;
  sat_solver2 *s_local;
  
  uVar1 = var_tag(s,v);
  if ((uVar1 & 2) == 0) {
    iVar2 = var_reason(s,v);
    pcVar3 = clause2_read(s,iVar2);
    if (pcVar3 != (clause *)0x0) {
      local_2c = 1;
      while( true ) {
        bVar4 = false;
        if (local_2c < (int)((uint)*pcVar3 >> 0xb)) {
          local_30 = lit_var((lit)pcVar3[(long)local_2c + 1]);
          bVar4 = local_30 != 0;
        }
        if (!bVar4) break;
        uVar1 = var_tag(s,local_30);
        if ((uVar1 & 1) == 0) {
          iVar2 = var_level(s,local_30);
          if (((iVar2 != 0) && (iVar2 = var_tag(s,local_30), iVar2 != 6)) &&
             ((iVar2 = var_tag(s,local_30), iVar2 == 2 ||
              ((iVar2 = var_lev_mark(s,local_30), iVar2 == 0 ||
               (iVar2 = solver2_lit_removable_rec(s,local_30), iVar2 == 0)))))) {
            var_add_tag(s,v,2);
            return 0;
          }
        }
        else {
          solver2_lit_removable_rec(s,local_30);
        }
        local_2c = local_2c + 1;
      }
      if ((s->fProofLogging != 0) && (uVar1 = var_tag(s,v), (uVar1 & 1) != 0)) {
        veci_push(&s->min_lit_order,v);
      }
      var_add_tag(s,v,6);
      return 1;
    }
    var_add_tag(s,v,2);
    s_local._4_4_ = 0;
  }
  else {
    uVar1 = var_tag(s,v);
    s_local._4_4_ = (uint)((uVar1 & 4) != 0);
  }
  return s_local._4_4_;
}

Assistant:

static int solver2_lit_removable_rec(sat_solver2* s, int v)
{
    // tag[0]: True if original conflict clause literal.
    // tag[1]: Processed by this procedure
    // tag[2]: 0=non-removable, 1=removable

    clause* c;
    int i, x;

    // skip visited
    if (var_tag(s,v) & 2)
        return (var_tag(s,v) & 4) > 0;

    // skip decisions on a wrong level
    c = clause2_read(s, var_reason(s,v));
    if ( c == NULL ){
        var_add_tag(s,v,2);
        return 0;
    }

    clause_foreach_var( c, x, i, 1 ){
        if (var_tag(s,x) & 1)
            solver2_lit_removable_rec(s, x);
        else{
            if (var_level(s,x) == 0 || var_tag(s,x) == 6) continue;     // -- 'x' checked before, found to be removable (or belongs to the toplevel)
            if (var_tag(s,x) == 2 || !var_lev_mark(s,x) || !solver2_lit_removable_rec(s, x))
            {  // -- 'x' checked before, found NOT to be removable, or it belongs to a wrong level, or cannot be removed
                var_add_tag(s,v,2);
                return 0;
            }
        }
    }
    if ( s->fProofLogging && (var_tag(s,v) & 1) )
        veci_push(&s->min_lit_order, v );
    var_add_tag(s,v,6);
    return 1;
}